

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_80(QPDF *pdf,char *arg2)

{
  pointer *this;
  bool bVar1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_00;
  const_reference pvVar2;
  reference pvVar3;
  QPDFWriter local_278 [8];
  QPDFWriter w2;
  QPDFWriter local_268 [8];
  QPDFWriter w1;
  QPDFObjectHandle local_258;
  QPDFPageObjectHelper local_248;
  QPDFPageDocumentHelper local_210;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_1f0 [24];
  undefined1 local_1d8 [8];
  value_type page2;
  QPDF pdf2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_168;
  reference local_150;
  QPDFObjectHandle *annot;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  undefined1 local_120 [8];
  QPDFAcroFormDocumentHelper afdh;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> old_fields;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_fields;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  QPDFObjectHandle old_annots;
  value_type page1;
  QPDFMatrix m;
  char *arg2_local;
  QPDF *pdf_local;
  
  QPDFMatrix::QPDFMatrix
            ((QPDFMatrix *)
             &page1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFMatrix::translate(306.0,396.0);
  QPDFMatrix::scale(0.4,0.4);
  this_00 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  pvVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this_00,0);
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)
             &old_annots.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pvVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"/Annots",&local_89);
  QPDFObjectHandle::getKey((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             &new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::set
            ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
             &afdh.m.
              super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper
            ((QPDFAcroFormDocumentHelper *)local_120,pdf);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&__range1,(QPDFObjectHandle *)local_68);
  QPDFAcroFormDocumentHelper::transformAnnotations
            ((QPDFObjectHandle *)local_120,(vector *)&__range1,
             (vector *)
             &new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (set *)&old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (QPDFMatrix *)
             &afdh.m.
              super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (QPDF *)&page1.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (QPDFAcroFormDocumentHelper *)0x0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range1);
  this = &new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage;
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this);
  annot = (QPDFObjectHandle *)
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                *)&annot);
    if (!bVar1) break;
    local_150 = __gnu_cxx::
                __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                ::operator*(&__end1);
    QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_68);
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            (&local_168,
             (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count);
  QPDFAcroFormDocumentHelper::addAndRenameFormFields(local_120,&local_168);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_168);
  QPDFMatrix::QPDFMatrix((QPDFMatrix *)&pdf2);
  page1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _pdf2;
  QPDFMatrix::translate(612.0,0.0);
  QPDFMatrix::scale(-1.0,1.0);
  QPDF::QPDF((QPDF *)&page2.m.
                      super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  QPDF::processFile((char *)&page2.m.
                             super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,arg2);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper
            (&local_210,
             (QPDF *)&page2.m.
                      super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  QPDFPageDocumentHelper::getAllPages();
  pvVar3 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at(local_1f0,0)
  ;
  QPDFPageObjectHelper::QPDFPageObjectHelper((QPDFPageObjectHelper *)local_1d8,pvVar3);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_1f0);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_210);
  QPDFObjectHandle::QPDFObjectHandle
            (&local_258,
             (QPDFObjectHandle *)
             &old_annots.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFPageObjectHelper::QPDFPageObjectHelper(&local_248,(QPDFObjectHandle *)&local_258);
  QPDFPageObjectHelper::copyAnnotations
            ((QPDFPageObjectHelper *)local_1d8,(QPDFMatrix *)&local_248,
             (QPDFAcroFormDocumentHelper *)
             &page1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(QPDFAcroFormDocumentHelper *)0x0);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_248);
  QPDFObjectHandle::~QPDFObjectHandle(&local_258);
  QPDFWriter::QPDFWriter(local_268,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(local_268,0));
  QPDFWriter::setQDFMode(SUB81(local_268,0));
  QPDFWriter::write();
  QPDFWriter::QPDFWriter
            (local_278,
             (QPDF *)&page2.m.
                      super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,"b.pdf");
  QPDFWriter::setStaticID(SUB81(local_278,0));
  QPDFWriter::setQDFMode(SUB81(local_278,0));
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_278);
  QPDFWriter::~QPDFWriter(local_268);
  QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_1d8);
  QPDF::~QPDF((QPDF *)&page2.m.
                       super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper((QPDFAcroFormDocumentHelper *)local_120);
  std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::~set
            ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
             &afdh.m.
              super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             &new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_68);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &old_annots.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void
test_80(QPDF& pdf, char const* arg2)
{
    // Exercise transform/copy annotations without passing in
    // QPDFAcroFormDocumentHelper pointers. The case of passing
    // them in is sufficiently exercised by testing through the
    // qpdf CLI.

    // The main file is a file that has lots of annotations. Arg2
    // is a file to copy annotations to.

    QPDFMatrix m;
    m.translate(306, 396);
    m.scale(0.4, 0.4);
    auto page1 = pdf.getAllPages().at(0);
    auto old_annots = page1.getKey("/Annots");
    // Transform annotations and copy them back to the same page.
    std::vector<QPDFObjectHandle> new_annots;
    std::vector<QPDFObjectHandle> new_fields;
    std::set<QPDFObjGen> old_fields;
    QPDFAcroFormDocumentHelper afdh(pdf);
    // Use defaults for from_qpdf and from_afdh.
    afdh.transformAnnotations(old_annots, new_annots, new_fields, old_fields, m);
    for (auto const& annot: new_annots) {
        old_annots.appendItem(annot);
    }
    afdh.addAndRenameFormFields(new_fields);

    m = QPDFMatrix();
    m.translate(612, 0);
    m.scale(-1, 1);
    QPDF pdf2;
    pdf2.processFile(arg2);
    auto page2 = QPDFPageDocumentHelper(pdf2).getAllPages().at(0);
    page2.copyAnnotations(page1, m);

    QPDFWriter w1(pdf, "a.pdf");
    w1.setStaticID(true);
    w1.setQDFMode(true);
    w1.write();

    QPDFWriter w2(pdf2, "b.pdf");
    w2.setStaticID(true);
    w2.setQDFMode(true);
    w2.write();
}